

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O1

optional<uint256> * __thiscall
detail::FromHex<uint256>(optional<uint256> *__return_storage_ptr__,detail *this,string_view str)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view str_00;
  string_view str_01;
  uint256 rv;
  base_blob<256U> local_48;
  long local_28;
  
  str_00._M_str = (char *)str._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (detail *)0x40) {
    str_01._M_str = str_00._M_str;
    str_01._M_len = 0x40;
    bVar1 = IsHex(str_01);
    if (bVar1) {
      local_48.m_data._M_elems[0x10] = '\0';
      local_48.m_data._M_elems[0x11] = '\0';
      local_48.m_data._M_elems[0x12] = '\0';
      local_48.m_data._M_elems[0x13] = '\0';
      local_48.m_data._M_elems[0x14] = '\0';
      local_48.m_data._M_elems[0x15] = '\0';
      local_48.m_data._M_elems[0x16] = '\0';
      local_48.m_data._M_elems[0x17] = '\0';
      local_48.m_data._M_elems[0x18] = '\0';
      local_48.m_data._M_elems[0x19] = '\0';
      local_48.m_data._M_elems[0x1a] = '\0';
      local_48.m_data._M_elems[0x1b] = '\0';
      local_48.m_data._M_elems[0x1c] = '\0';
      local_48.m_data._M_elems[0x1d] = '\0';
      local_48.m_data._M_elems[0x1e] = '\0';
      local_48.m_data._M_elems[0x1f] = '\0';
      local_48.m_data._M_elems[0] = '\0';
      local_48.m_data._M_elems[1] = '\0';
      local_48.m_data._M_elems[2] = '\0';
      local_48.m_data._M_elems[3] = '\0';
      local_48.m_data._M_elems[4] = '\0';
      local_48.m_data._M_elems[5] = '\0';
      local_48.m_data._M_elems[6] = '\0';
      local_48.m_data._M_elems[7] = '\0';
      local_48.m_data._M_elems[8] = '\0';
      local_48.m_data._M_elems[9] = '\0';
      local_48.m_data._M_elems[10] = '\0';
      local_48.m_data._M_elems[0xb] = '\0';
      local_48.m_data._M_elems[0xc] = '\0';
      local_48.m_data._M_elems[0xd] = '\0';
      local_48.m_data._M_elems[0xe] = '\0';
      local_48.m_data._M_elems[0xf] = '\0';
      str_00._M_len = 0x40;
      base_blob<256U>::SetHexDeprecated(&local_48,str_00);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           local_48.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           local_48.m_data._M_elems._24_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload = local_48.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           local_48.m_data._M_elems._8_8_;
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = true;
      goto LAB_002b7973;
    }
  }
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
LAB_002b7973:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromHex(std::string_view str)
{
    if (uintN_t::size() * 2 != str.size() || !IsHex(str)) return std::nullopt;
    uintN_t rv;
    rv.SetHexDeprecated(str);
    return rv;
}